

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-inl.h
# Opt level: O0

void __thiscall spdlog::spdlog_ex::spdlog_ex(spdlog_ex *this,string *msg,int last_errno)

{
  undefined4 error_code;
  char *message;
  v10 local_178 [55];
  allocator<char> local_141;
  undefined1 local_140 [8];
  memory_buf_t outbuf;
  int last_errno_local;
  string *msg_local;
  spdlog_ex *this_local;
  
  outbuf._284_4_ = last_errno;
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__spdlog_ex_00313230;
  std::__cxx11::string::string((string *)&this->msg_);
  std::allocator<char>::allocator();
  fmt::v10::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::basic_memory_buffer
            ((basic_memory_buffer<char,_250UL,_std::allocator<char>_> *)local_140,&local_141);
  std::allocator<char>::~allocator(&local_141);
  error_code = outbuf._284_4_;
  message = (char *)std::__cxx11::string::c_str();
  fmt::v10::format_system_error((buffer<char> *)local_140,error_code,message);
  fmt::v10::to_string<char,250ul>
            (local_178,(basic_memory_buffer<char,_250UL,_std::allocator<char>_> *)local_140);
  std::__cxx11::string::operator=((string *)&this->msg_,(string *)local_178);
  std::__cxx11::string::~string((string *)local_178);
  fmt::v10::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_250UL,_std::allocator<char>_> *)local_140);
  return;
}

Assistant:

SPDLOG_INLINE spdlog_ex::spdlog_ex(const std::string &msg, int last_errno) {
#ifdef SPDLOG_USE_STD_FORMAT
    msg_ = std::system_error(std::error_code(last_errno, std::generic_category()), msg).what();
#else
    memory_buf_t outbuf;
    fmt::format_system_error(outbuf, last_errno, msg.c_str());
    msg_ = fmt::to_string(outbuf);
#endif
}